

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_hmac_finish_internal(psa_hmac_internal_data *hmac,uint8_t *mac,size_t mac_size)

{
  size_t input_length;
  psa_status_t local_84;
  psa_status_t status;
  size_t block_size;
  size_t hash_size;
  uint8_t local_68 [4];
  psa_algorithm_t hash_alg;
  uint8_t tmp [64];
  size_t mac_size_local;
  uint8_t *mac_local;
  psa_hmac_internal_data *hmac_local;
  
  hash_size._4_4_ = (hmac->hash_ctx).alg;
  block_size = 0;
  tmp._56_8_ = mac_size;
  input_length = psa_get_hash_block_size(hash_size._4_4_);
  hmac_local._4_4_ = psa_hash_finish(&hmac->hash_ctx,local_68,0x40,&block_size);
  if (hmac_local._4_4_ == 0) {
    local_84 = psa_hash_setup(&hmac->hash_ctx,hash_size._4_4_);
    if ((((local_84 == 0) &&
         (local_84 = psa_hash_update(&hmac->hash_ctx,hmac->opad,input_length), local_84 == 0)) &&
        (local_84 = psa_hash_update(&hmac->hash_ctx,local_68,block_size), local_84 == 0)) &&
       (local_84 = psa_hash_finish(&hmac->hash_ctx,local_68,0x40,&block_size), local_84 == 0)) {
      memcpy(mac,local_68,tmp._56_8_);
    }
    mbedtls_platform_zeroize(local_68,block_size);
    hmac_local._4_4_ = local_84;
  }
  return hmac_local._4_4_;
}

Assistant:

static psa_status_t psa_hmac_finish_internal( psa_hmac_internal_data *hmac,
                                              uint8_t *mac,
                                              size_t mac_size )
{
    uint8_t tmp[MBEDTLS_MD_MAX_SIZE];
    psa_algorithm_t hash_alg = hmac->hash_ctx.alg;
    size_t hash_size = 0;
    size_t block_size = psa_get_hash_block_size( hash_alg );
    psa_status_t status;

    status = psa_hash_finish( &hmac->hash_ctx, tmp, sizeof( tmp ), &hash_size );
    if( status != PSA_SUCCESS )
        return( status );
    /* From here on, tmp needs to be wiped. */

    status = psa_hash_setup( &hmac->hash_ctx, hash_alg );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_update( &hmac->hash_ctx, hmac->opad, block_size );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_update( &hmac->hash_ctx, tmp, hash_size );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_finish( &hmac->hash_ctx, tmp, sizeof( tmp ), &hash_size );
    if( status != PSA_SUCCESS )
        goto exit;

    memcpy( mac, tmp, mac_size );

exit:
    mbedtls_platform_zeroize( tmp, hash_size );
    return( status );
}